

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdtrans.c
# Opt level: O1

jvirt_barray_ptr * jpeg_read_coefficients(j_decompress_ptr cinfo)

{
  jpeg_progress_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  if (cinfo->global_state == 0xca) {
    cinfo->buffered_image = 1;
    jpeg_core_output_dimensions(cinfo);
    if (cinfo->arith_code == 0) {
      jinit_huff_decoder(cinfo);
    }
    else {
      jinit_arith_decoder(cinfo);
    }
    jinit_d_coef_controller(cinfo,1);
    (*cinfo->mem->realize_virt_arrays)((j_common_ptr)cinfo);
    (*cinfo->inputctl->start_input_pass)(cinfo);
    pjVar1 = cinfo->progress;
    if (pjVar1 != (jpeg_progress_mgr *)0x0) {
      if (cinfo->progressive_mode == 0) {
        if (cinfo->inputctl->has_multiple_scans == 0) {
          iVar4 = 1;
        }
        else {
          iVar4 = cinfo->num_components;
        }
      }
      else {
        iVar4 = cinfo->num_components * 3 + 2;
      }
      pjVar1->pass_counter = 0;
      pjVar1->pass_limit = (long)iVar4 * (ulong)cinfo->total_iMCU_rows;
      pjVar1->completed_passes = 0;
      pjVar1->total_passes = 1;
    }
    cinfo->global_state = 0xd1;
  }
  if (cinfo->global_state == 0xd1) {
    do {
      if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
        (*cinfo->progress->progress_monitor)((j_common_ptr)cinfo);
      }
      uVar3 = (*cinfo->inputctl->consume_input)(cinfo);
      if (uVar3 == 0) {
        iVar4 = 1;
      }
      else if (uVar3 == 2) {
        iVar4 = 2;
      }
      else {
        pjVar1 = cinfo->progress;
        iVar4 = 0;
        if ((uVar3 & 0xfffffffd) == 1 && pjVar1 != (jpeg_progress_mgr *)0x0) {
          lVar5 = pjVar1->pass_counter + 1;
          pjVar1->pass_counter = lVar5;
          if (pjVar1->pass_limit <= lVar5) {
            pjVar1->pass_limit = pjVar1->pass_limit + (ulong)cinfo->total_iMCU_rows;
            iVar4 = 0;
          }
        }
      }
    } while (iVar4 == 0);
    if (iVar4 == 1) {
      return (jvirt_barray_ptr *)0x0;
    }
    cinfo->global_state = 0xd2;
  }
  iVar4 = cinfo->global_state;
  if (((iVar4 == 0xd2) || (iVar4 == 0xcf)) && (cinfo->buffered_image != 0)) {
    return cinfo->coef->coef_arrays;
  }
  pjVar2 = cinfo->err;
  pjVar2->msg_code = 0x15;
  (pjVar2->msg_parm).i[0] = iVar4;
  (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  return (jvirt_barray_ptr *)0x0;
}

Assistant:

GLOBAL(jvirt_barray_ptr *)
jpeg_read_coefficients (j_decompress_ptr cinfo)
{
  if (cinfo->global_state == DSTATE_READY) {
    /* First call: initialize active modules */
    transdecode_master_selection(cinfo);
    cinfo->global_state = DSTATE_RDCOEFS;
  }
  if (cinfo->global_state == DSTATE_RDCOEFS) {
    /* Absorb whole file into the coef buffer */
    for (;;) {
      int retcode;
      /* Call progress monitor hook if present */
      if (cinfo->progress != NULL)
	(*cinfo->progress->progress_monitor) ((j_common_ptr) cinfo);
      /* Absorb some more input */
      retcode = (*cinfo->inputctl->consume_input) (cinfo);
      if (retcode == JPEG_SUSPENDED)
	return NULL;
      if (retcode == JPEG_REACHED_EOI)
	break;
      /* Advance progress counter if appropriate */
      if (cinfo->progress != NULL &&
	  (retcode == JPEG_ROW_COMPLETED || retcode == JPEG_REACHED_SOS)) {
	if (++cinfo->progress->pass_counter >= cinfo->progress->pass_limit) {
	  /* startup underestimated number of scans; ratchet up one scan */
	  cinfo->progress->pass_limit += (long) cinfo->total_iMCU_rows;
	}
      }
    }
    /* Set state so that jpeg_finish_decompress does the right thing */
    cinfo->global_state = DSTATE_STOPPING;
  }
  /* At this point we should be in state DSTATE_STOPPING if being used
   * standalone, or in state DSTATE_BUFIMAGE if being invoked to get access
   * to the coefficients during a full buffered-image-mode decompression.
   */
  if ((cinfo->global_state == DSTATE_STOPPING ||
       cinfo->global_state == DSTATE_BUFIMAGE) && cinfo->buffered_image) {
    return cinfo->coef->coef_arrays;
  }
  /* Oops, improper usage */
  ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  return NULL;			/* keep compiler happy */
}